

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_1,_true,_embree::avx512::SubGridIntersector1Pluecker<4,_true>_>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  ushort uVar2;
  ushort uVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  bool bVar29;
  ulong uVar30;
  float fVar31;
  float fVar63;
  float fVar64;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  float fVar65;
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined4 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [16];
  float fVar94;
  undefined1 auVar93 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [32];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  UVIdentity<8> mapUV;
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_b29;
  RTCIntersectArguments *local_b28;
  RTCRayQueryContext *local_b20;
  Ray *local_b18;
  ulong local_b10;
  ulong local_b08;
  uint local_afc;
  uint local_af8;
  int local_af4;
  Geometry *local_af0;
  Scene *local_ae8;
  ulong local_ae0;
  RayQueryContext *local_ad8;
  ulong local_ad0;
  ulong local_ac8;
  ulong local_ac0;
  long local_ab8;
  long local_ab0;
  ulong *local_aa8;
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  ulong local_a70;
  long local_a68;
  float local_a60;
  undefined4 local_a5c;
  undefined4 local_a58;
  undefined4 local_a54;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  uint local_a44;
  uint local_a40;
  RTCFilterFunctionNArguments local_a30;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  float local_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 *local_8e0;
  byte local_8d8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  float local_860 [4];
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  uint uStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  undefined1 auVar34 [16];
  
  local_ad8 = context;
  local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_800 != 8) {
    fVar94 = ray->tfar;
    if (0.0 <= fVar94) {
      local_aa8 = local_7f8;
      aVar1 = (ray->dir).field_0;
      auVar37 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar32 = vandps_avx512vl((undefined1  [16])aVar1,auVar32);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      uVar22 = vcmpps_avx512vl(auVar32,auVar33,1);
      auVar85._8_4_ = 0x3f800000;
      auVar85._0_8_ = 0x3f8000003f800000;
      auVar85._12_4_ = 0x3f800000;
      auVar32 = vdivps_avx(auVar85,(undefined1  [16])aVar1);
      auVar33 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
      bVar29 = (bool)((byte)uVar22 & 1);
      auVar34._0_4_ = (uint)bVar29 * auVar33._0_4_ | (uint)!bVar29 * auVar32._0_4_;
      bVar29 = (bool)((byte)(uVar22 >> 1) & 1);
      auVar34._4_4_ = (uint)bVar29 * auVar33._4_4_ | (uint)!bVar29 * auVar32._4_4_;
      bVar29 = (bool)((byte)(uVar22 >> 2) & 1);
      auVar34._8_4_ = (uint)bVar29 * auVar33._8_4_ | (uint)!bVar29 * auVar32._8_4_;
      bVar29 = (bool)((byte)(uVar22 >> 3) & 1);
      auVar34._12_4_ = (uint)bVar29 * auVar33._12_4_ | (uint)!bVar29 * auVar32._12_4_;
      auVar35._8_4_ = 0x3f7ffffa;
      auVar35._0_8_ = 0x3f7ffffa3f7ffffa;
      auVar35._12_4_ = 0x3f7ffffa;
      auVar35 = vmulps_avx512vl(auVar34,auVar35);
      auVar36._8_4_ = 0x3f800003;
      auVar36._0_8_ = 0x3f8000033f800003;
      auVar36._12_4_ = 0x3f800003;
      auVar36 = vmulps_avx512vl(auVar34,auVar36);
      auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[0]));
      auVar102 = ZEXT1664(auVar32);
      auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[1]));
      auVar103 = ZEXT1664(auVar32);
      auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->org).field_0.m128[2]));
      auVar104 = ZEXT1664(auVar32);
      bVar29 = auVar35._0_4_ < 0.0;
      auVar32 = vbroadcastss_avx512vl(auVar35);
      auVar105 = ZEXT1664(auVar32);
      auVar32 = vmovshdup_avx(auVar35);
      auVar33 = vshufps_avx512vl(auVar35,auVar35,0x55);
      auVar106 = ZEXT1664(auVar33);
      auVar33 = vshufpd_avx(auVar35,auVar35,1);
      auVar35 = vshufps_avx512vl(auVar35,auVar35,0xaa);
      auVar107 = ZEXT1664(auVar35);
      fVar64 = auVar36._0_4_;
      local_960 = vshufps_avx(auVar36,auVar36,0x55);
      auVar97 = ZEXT1664(local_960);
      local_970 = vshufps_avx(auVar36,auVar36,0xaa);
      auVar98 = ZEXT1664(local_970);
      uVar22 = (ulong)bVar29 << 4;
      uVar25 = (ulong)(auVar32._0_4_ < 0.0) << 4 | 0x20;
      uVar26 = (ulong)(auVar33._0_4_ < 0.0) << 4 | 0x40;
      uVar27 = uVar22 ^ 0x10;
      uVar28 = uVar25 ^ 0x10;
      uVar79 = auVar37._0_4_;
      local_980._4_4_ = uVar79;
      local_980._0_4_ = uVar79;
      local_980._8_4_ = uVar79;
      local_980._12_4_ = uVar79;
      auVar100 = ZEXT1664(local_980);
      local_990._4_4_ = fVar94;
      local_990._0_4_ = fVar94;
      local_990._8_4_ = fVar94;
      local_990._12_4_ = fVar94;
      auVar101 = ZEXT1664(local_990);
      local_a70 = (ulong)(((uint)bVar29 << 4) >> 2);
      local_a78 = uVar27 >> 2;
      local_a80 = uVar25 >> 2;
      local_a88 = uVar28 >> 2;
      local_a90 = uVar26 >> 2;
      local_a98 = (uVar26 ^ 0x10) >> 2;
      local_ac8 = uVar22;
      local_950 = fVar64;
      fStack_94c = fVar64;
      fStack_948 = fVar64;
      fStack_944 = fVar64;
      local_ad0 = uVar25;
      fVar94 = fVar64;
      fVar31 = fVar64;
      fVar63 = fVar64;
      local_b18 = ray;
      do {
        uVar24 = local_aa8[-1];
        local_aa8 = local_aa8 + -1;
        while ((uVar24 & 8) == 0) {
          auVar32 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar22),auVar102._0_16_);
          auVar32 = vmulps_avx512vl(auVar105._0_16_,auVar32);
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar25),auVar103._0_16_);
          auVar37 = vmulps_avx512vl(auVar106._0_16_,auVar37);
          auVar32 = vmaxps_avx(auVar32,auVar37);
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar26),auVar104._0_16_);
          auVar37 = vmulps_avx512vl(auVar107._0_16_,auVar37);
          auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar27),auVar102._0_16_);
          auVar76._0_4_ = fVar64 * auVar33._0_4_;
          auVar76._4_4_ = fVar94 * auVar33._4_4_;
          auVar76._8_4_ = fVar31 * auVar33._8_4_;
          auVar76._12_4_ = fVar63 * auVar33._12_4_;
          auVar33 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + uVar28),auVar103._0_16_);
          auVar80._0_4_ = auVar97._0_4_ * auVar33._0_4_;
          auVar80._4_4_ = auVar97._4_4_ * auVar33._4_4_;
          auVar80._8_4_ = auVar97._8_4_ * auVar33._8_4_;
          auVar80._12_4_ = auVar97._12_4_ * auVar33._12_4_;
          auVar33 = vminps_avx(auVar76,auVar80);
          auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar24 + 0x20 + (uVar26 ^ 0x10)),
                                    auVar104._0_16_);
          auVar81._0_4_ = auVar98._0_4_ * auVar35._0_4_;
          auVar81._4_4_ = auVar98._4_4_ * auVar35._4_4_;
          auVar81._8_4_ = auVar98._8_4_ * auVar35._8_4_;
          auVar81._12_4_ = auVar98._12_4_ * auVar35._12_4_;
          auVar37 = vmaxps_avx(auVar37,auVar100._0_16_);
          auVar32 = vmaxps_avx(auVar32,auVar37);
          auVar37 = vminps_avx(auVar81,auVar101._0_16_);
          auVar37 = vminps_avx(auVar33,auVar37);
          uVar30 = vcmpps_avx512vl(auVar32,auVar37,2);
          if ((char)uVar30 == '\0') goto LAB_0068d85e;
          uVar17 = uVar24 & 0xfffffffffffffff0;
          lVar18 = 0;
          for (uVar24 = uVar30; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
            lVar18 = lVar18 + 1;
          }
          uVar24 = *(ulong *)(uVar17 + lVar18 * 8);
          uVar20 = (uint)uVar30 - 1 & (uint)uVar30;
          uVar30 = (ulong)uVar20;
          if (uVar20 != 0) {
            *local_aa8 = uVar24;
            lVar18 = 0;
            for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar18 = lVar18 + 1;
            }
            uVar20 = uVar20 - 1 & uVar20;
            uVar30 = (ulong)uVar20;
            bVar29 = uVar20 == 0;
            while( true ) {
              local_aa8 = local_aa8 + 1;
              uVar24 = *(ulong *)(uVar17 + lVar18 * 8);
              if (bVar29) break;
              *local_aa8 = uVar24;
              lVar18 = 0;
              for (uVar24 = uVar30; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
                lVar18 = lVar18 + 1;
              }
              uVar30 = uVar30 - 1 & uVar30;
              bVar29 = uVar30 == 0;
            }
          }
        }
        local_ab0 = (ulong)((uint)uVar24 & 0xf) - 8;
        if (local_ab0 != 0) {
          uVar24 = uVar24 & 0xfffffffffffffff0;
          local_ab8 = 0;
          do {
            lVar18 = local_ab8 * 0x58;
            local_a68 = uVar24 + lVar18;
            auVar37._8_8_ = 0;
            auVar37._0_8_ = *(ulong *)(uVar24 + 0x20 + lVar18);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = *(ulong *)(uVar24 + 0x24 + lVar18);
            uVar17 = vpcmpub_avx512vl(auVar37,auVar72,2);
            uVar79 = *(undefined4 *)(uVar24 + 0x38 + lVar18);
            auVar69._4_4_ = uVar79;
            auVar69._0_4_ = uVar79;
            auVar69._8_4_ = uVar79;
            auVar69._12_4_ = uVar79;
            uVar79 = *(undefined4 *)(uVar24 + 0x44 + lVar18);
            auVar73._4_4_ = uVar79;
            auVar73._0_4_ = uVar79;
            auVar73._8_4_ = uVar79;
            auVar73._12_4_ = uVar79;
            auVar77._8_8_ = 0;
            auVar77._0_8_ = *(ulong *)(local_a70 + 0x20 + local_a68);
            auVar32 = vpmovzxbd_avx(auVar77);
            auVar32 = vcvtdq2ps_avx(auVar32);
            auVar37 = vfmadd213ps_fma(auVar32,auVar73,auVar69);
            auVar82._8_8_ = 0;
            auVar82._0_8_ = *(ulong *)(local_a78 + 0x20 + local_a68);
            auVar32 = vpmovzxbd_avx(auVar82);
            auVar32 = vcvtdq2ps_avx(auVar32);
            auVar33 = vfmadd213ps_fma(auVar32,auVar73,auVar69);
            uVar79 = *(undefined4 *)(uVar24 + 0x3c + lVar18);
            auVar70._4_4_ = uVar79;
            auVar70._0_4_ = uVar79;
            auVar70._8_4_ = uVar79;
            auVar70._12_4_ = uVar79;
            uVar79 = *(undefined4 *)(uVar24 + 0x48 + lVar18);
            auVar74._4_4_ = uVar79;
            auVar74._0_4_ = uVar79;
            auVar74._8_4_ = uVar79;
            auVar74._12_4_ = uVar79;
            auVar86._8_8_ = 0;
            auVar86._0_8_ = *(ulong *)(local_a80 + 0x20 + local_a68);
            auVar32 = vpmovzxbd_avx(auVar86);
            auVar32 = vcvtdq2ps_avx(auVar32);
            auVar35 = vfmadd213ps_fma(auVar32,auVar74,auVar70);
            auVar89._8_8_ = 0;
            auVar89._0_8_ = *(ulong *)(local_a88 + 0x20 + local_a68);
            auVar32 = vpmovzxbd_avx(auVar89);
            auVar32 = vcvtdq2ps_avx(auVar32);
            auVar36 = vfmadd213ps_fma(auVar32,auVar74,auVar70);
            uVar79 = *(undefined4 *)(uVar24 + 0x40 + lVar18);
            auVar71._4_4_ = uVar79;
            auVar71._0_4_ = uVar79;
            auVar71._8_4_ = uVar79;
            auVar71._12_4_ = uVar79;
            uVar79 = *(undefined4 *)(uVar24 + 0x4c + lVar18);
            auVar75._4_4_ = uVar79;
            auVar75._0_4_ = uVar79;
            auVar75._8_4_ = uVar79;
            auVar75._12_4_ = uVar79;
            auVar90._8_8_ = 0;
            auVar90._0_8_ = *(ulong *)(local_a90 + 0x20 + local_a68);
            auVar32 = vpmovzxbd_avx(auVar90);
            auVar32 = vcvtdq2ps_avx(auVar32);
            auVar34 = vfmadd213ps_fma(auVar32,auVar75,auVar71);
            auVar92._8_8_ = 0;
            auVar92._0_8_ = *(ulong *)(local_a98 + 0x20 + local_a68);
            auVar32 = vpmovzxbd_avx(auVar92);
            auVar32 = vcvtdq2ps_avx(auVar32);
            auVar85 = vfmadd213ps_fma(auVar32,auVar75,auVar71);
            auVar32 = vsubps_avx512vl(auVar37,auVar102._0_16_);
            auVar32 = vmulps_avx512vl(auVar105._0_16_,auVar32);
            auVar37 = vsubps_avx512vl(auVar35,auVar103._0_16_);
            auVar37 = vmulps_avx512vl(auVar106._0_16_,auVar37);
            auVar32 = vmaxps_avx(auVar32,auVar37);
            auVar37 = vsubps_avx512vl(auVar34,auVar104._0_16_);
            auVar37 = vmulps_avx512vl(auVar107._0_16_,auVar37);
            auVar33 = vsubps_avx512vl(auVar33,auVar102._0_16_);
            auVar78._0_4_ = fVar64 * auVar33._0_4_;
            auVar78._4_4_ = fVar94 * auVar33._4_4_;
            auVar78._8_4_ = fVar31 * auVar33._8_4_;
            auVar78._12_4_ = fVar63 * auVar33._12_4_;
            auVar33 = vsubps_avx512vl(auVar36,auVar103._0_16_);
            auVar83._0_4_ = auVar97._0_4_ * auVar33._0_4_;
            auVar83._4_4_ = auVar97._4_4_ * auVar33._4_4_;
            auVar83._8_4_ = auVar97._8_4_ * auVar33._8_4_;
            auVar83._12_4_ = auVar97._12_4_ * auVar33._12_4_;
            auVar33 = vminps_avx(auVar78,auVar83);
            auVar35 = vsubps_avx512vl(auVar85,auVar104._0_16_);
            auVar84._0_4_ = auVar98._0_4_ * auVar35._0_4_;
            auVar84._4_4_ = auVar98._4_4_ * auVar35._4_4_;
            auVar84._8_4_ = auVar98._8_4_ * auVar35._8_4_;
            auVar84._12_4_ = auVar98._12_4_ * auVar35._12_4_;
            auVar37 = vmaxps_avx(auVar37,auVar100._0_16_);
            auVar32 = vmaxps_avx(auVar32,auVar37);
            auVar37 = vminps_avx(auVar84,auVar101._0_16_);
            auVar37 = vminps_avx(auVar33,auVar37);
            uVar30 = vcmpps_avx512vl(auVar32,auVar37,2);
            uVar30 = uVar17 & 0xff & uVar30;
            if ((char)uVar30 != '\0') {
              local_ae8 = local_ad8->scene;
              do {
                local_aa0 = uVar30;
                lVar18 = 0;
                for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
                  lVar18 = lVar18 + 1;
                }
                uVar2 = *(ushort *)(local_a68 + lVar18 * 8);
                uVar3 = *(ushort *)(local_a68 + 2 + lVar18 * 8);
                local_ae0 = (ulong)*(uint *)(local_a68 + 0x50);
                local_ac0 = (ulong)*(uint *)(local_a68 + 4 + lVar18 * 8);
                pGVar4 = (local_ae8->geometries).items[local_ae0].ptr;
                lVar18 = *(long *)&pGVar4->field_0x58;
                lVar5 = *(long *)&pGVar4[1].time_range.upper;
                lVar19 = pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                         * local_ac0;
                local_af8 = uVar2 & 0x7fff;
                local_afc = uVar3 & 0x7fff;
                uVar20 = *(uint *)(lVar18 + 4 + lVar19);
                uVar25 = (ulong)uVar20;
                uVar30 = (ulong)(uVar20 * local_afc + *(int *)(lVar18 + lVar19) + local_af8);
                p_Var6 = pGVar4[1].intersectionFilterN;
                auVar32 = *(undefined1 (*) [16])(lVar5 + (uVar30 + 1) * (long)p_Var6);
                auVar37 = *(undefined1 (*) [16])(lVar5 + (uVar30 + uVar25) * (long)p_Var6);
                lVar21 = uVar30 + uVar25 + 1;
                auVar33 = *(undefined1 (*) [16])(lVar5 + lVar21 * (long)p_Var6);
                uVar22 = (ulong)(-1 < (short)uVar2);
                auVar35 = *(undefined1 (*) [16])(lVar5 + (uVar30 + uVar22 + 1) * (long)p_Var6);
                lVar23 = uVar22 + lVar21;
                auVar36 = *(undefined1 (*) [16])(lVar5 + lVar23 * (long)p_Var6);
                uVar22 = 0;
                if (-1 < (short)uVar3) {
                  uVar22 = uVar25;
                }
                auVar34 = *(undefined1 (*) [16])(lVar5 + (uVar30 + uVar25 + uVar22) * (long)p_Var6);
                auVar85 = *(undefined1 (*) [16])(lVar5 + (lVar21 + uVar22) * (long)p_Var6);
                auVar47._16_16_ = *(undefined1 (*) [16])(lVar5 + (uVar22 + lVar23) * (long)p_Var6);
                auVar47._0_16_ = auVar33;
                auVar80 = vunpcklps_avx(auVar32,auVar36);
                auVar76 = vunpckhps_avx(auVar32,auVar36);
                auVar81 = vunpcklps_avx(auVar35,auVar33);
                auVar35 = vunpckhps_avx(auVar35,auVar33);
                auVar69 = vunpcklps_avx(auVar76,auVar35);
                auVar70 = vunpcklps_avx(auVar80,auVar81);
                auVar35 = vunpckhps_avx(auVar80,auVar81);
                auVar80 = vunpcklps_avx(auVar37,auVar85);
                auVar76 = vunpckhps_avx(auVar37,auVar85);
                auVar81 = vunpcklps_avx(auVar33,auVar34);
                auVar34 = vunpckhps_avx(auVar33,auVar34);
                auVar76 = vunpcklps_avx(auVar76,auVar34);
                auVar71 = vunpcklps_avx(auVar80,auVar81);
                auVar34 = vunpckhps_avx(auVar80,auVar81);
                auVar44._16_16_ = auVar85;
                auVar44._0_16_ = auVar37;
                auVar42._16_16_ = auVar36;
                auVar42._0_16_ = auVar32;
                auVar62 = vunpcklps_avx(auVar42,auVar44);
                auVar39._16_16_ = auVar33;
                auVar39._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)p_Var6 * uVar30);
                auVar61 = vunpcklps_avx(auVar39,auVar47);
                auVar58 = vunpcklps_avx(auVar61,auVar62);
                auVar61 = vunpckhps_avx(auVar61,auVar62);
                auVar62 = vunpckhps_avx(auVar42,auVar44);
                auVar57 = vunpckhps_avx(auVar39,auVar47);
                auVar57 = vunpcklps_avx(auVar57,auVar62);
                auVar43._16_16_ = auVar70;
                auVar43._0_16_ = auVar70;
                auVar45._16_16_ = auVar35;
                auVar45._0_16_ = auVar35;
                auVar46._16_16_ = auVar69;
                auVar46._0_16_ = auVar69;
                auVar48._16_16_ = auVar71;
                auVar48._0_16_ = auVar71;
                auVar50._16_16_ = auVar34;
                auVar50._0_16_ = auVar34;
                uVar79 = *(undefined4 *)&(local_b18->org).field_0;
                auVar51._4_4_ = uVar79;
                auVar51._0_4_ = uVar79;
                auVar51._8_4_ = uVar79;
                auVar51._12_4_ = uVar79;
                auVar51._16_4_ = uVar79;
                auVar51._20_4_ = uVar79;
                auVar51._24_4_ = uVar79;
                auVar51._28_4_ = uVar79;
                uVar79 = *(undefined4 *)((long)&(local_b18->org).field_0 + 4);
                auVar52._4_4_ = uVar79;
                auVar52._0_4_ = uVar79;
                auVar52._8_4_ = uVar79;
                auVar52._12_4_ = uVar79;
                auVar52._16_4_ = uVar79;
                auVar52._20_4_ = uVar79;
                auVar52._24_4_ = uVar79;
                auVar52._28_4_ = uVar79;
                auVar38 = vbroadcastss_avx512vl(ZEXT416((uint)(local_b18->org).field_0.m128[2]));
                uVar79 = *(undefined4 *)&(local_b18->dir).field_0;
                auVar91._4_4_ = uVar79;
                auVar91._0_4_ = uVar79;
                auVar91._8_4_ = uVar79;
                auVar91._12_4_ = uVar79;
                auVar91._16_4_ = uVar79;
                auVar91._20_4_ = uVar79;
                auVar91._24_4_ = uVar79;
                auVar91._28_4_ = uVar79;
                auVar49._16_16_ = auVar76;
                auVar49._0_16_ = auVar76;
                uVar79 = *(undefined4 *)((long)&(local_b18->dir).field_0 + 4);
                auVar95._4_4_ = uVar79;
                auVar95._0_4_ = uVar79;
                auVar95._8_4_ = uVar79;
                auVar95._12_4_ = uVar79;
                auVar95._16_4_ = uVar79;
                auVar95._20_4_ = uVar79;
                auVar95._24_4_ = uVar79;
                auVar95._28_4_ = uVar79;
                fVar94 = (local_b18->dir).field_0.m128[2];
                auVar99._4_4_ = fVar94;
                auVar99._0_4_ = fVar94;
                auVar99._8_4_ = fVar94;
                auVar99._12_4_ = fVar94;
                auVar99._16_4_ = fVar94;
                auVar99._20_4_ = fVar94;
                auVar99._24_4_ = fVar94;
                auVar99._28_4_ = fVar94;
                auVar62 = vsubps_avx(auVar58,auVar51);
                auVar61 = vsubps_avx(auVar61,auVar52);
                auVar39 = vsubps_avx512vl(auVar57,auVar38);
                auVar57 = vsubps_avx(auVar43,auVar51);
                auVar58 = vsubps_avx(auVar45,auVar52);
                auVar40 = vsubps_avx512vl(auVar46,auVar38);
                auVar41 = vsubps_avx512vl(auVar48,auVar51);
                auVar42 = vsubps_avx512vl(auVar50,auVar52);
                auVar43 = vsubps_avx512vl(auVar49,auVar38);
                auVar44 = vsubps_avx512vl(auVar41,auVar62);
                auVar45 = vsubps_avx512vl(auVar42,auVar61);
                auVar46 = vsubps_avx512vl(auVar43,auVar39);
                auVar47 = vsubps_avx512vl(auVar62,auVar57);
                auVar48 = vsubps_avx512vl(auVar61,auVar58);
                auVar49 = vsubps_avx512vl(auVar39,auVar40);
                auVar50 = vsubps_avx512vl(auVar57,auVar41);
                auVar51 = vsubps_avx512vl(auVar58,auVar42);
                auVar52 = vsubps_avx512vl(auVar40,auVar43);
                auVar53 = vaddps_avx512vl(auVar41,auVar62);
                auVar54 = vaddps_avx512vl(auVar42,auVar61);
                auVar38 = vaddps_avx512vl(auVar43,auVar39);
                auVar55 = vmulps_avx512vl(auVar54,auVar46);
                auVar55 = vfmsub231ps_avx512vl(auVar55,auVar45,auVar38);
                auVar38 = vmulps_avx512vl(auVar38,auVar44);
                auVar56 = vfmsub231ps_avx512vl(auVar38,auVar46,auVar53);
                auVar38._4_4_ = auVar53._4_4_ * auVar45._4_4_;
                auVar38._0_4_ = auVar53._0_4_ * auVar45._0_4_;
                auVar38._8_4_ = auVar53._8_4_ * auVar45._8_4_;
                auVar38._12_4_ = auVar53._12_4_ * auVar45._12_4_;
                auVar38._16_4_ = auVar53._16_4_ * auVar45._16_4_;
                auVar38._20_4_ = auVar53._20_4_ * auVar45._20_4_;
                auVar38._24_4_ = auVar53._24_4_ * auVar45._24_4_;
                auVar38._28_4_ = auVar53._28_4_;
                auVar32 = vfmsub231ps_fma(auVar38,auVar44,auVar54);
                auVar54._0_4_ = fVar94 * auVar32._0_4_;
                auVar54._4_4_ = fVar94 * auVar32._4_4_;
                auVar54._8_4_ = fVar94 * auVar32._8_4_;
                auVar54._12_4_ = fVar94 * auVar32._12_4_;
                auVar54._16_4_ = fVar94 * 0.0;
                auVar54._20_4_ = fVar94 * 0.0;
                auVar54._24_4_ = fVar94 * 0.0;
                auVar54._28_4_ = 0;
                auVar38 = vfmadd231ps_avx512vl(auVar54,auVar95,auVar56);
                auVar38 = vfmadd231ps_avx512vl(auVar38,auVar91,auVar55);
                auVar56._0_4_ = auVar62._0_4_ + auVar57._0_4_;
                auVar56._4_4_ = auVar62._4_4_ + auVar57._4_4_;
                auVar56._8_4_ = auVar62._8_4_ + auVar57._8_4_;
                auVar56._12_4_ = auVar62._12_4_ + auVar57._12_4_;
                auVar56._16_4_ = auVar62._16_4_ + auVar57._16_4_;
                auVar56._20_4_ = auVar62._20_4_ + auVar57._20_4_;
                auVar56._24_4_ = auVar62._24_4_ + auVar57._24_4_;
                auVar56._28_4_ = auVar62._28_4_ + auVar57._28_4_;
                auVar53 = vaddps_avx512vl(auVar61,auVar58);
                auVar54 = vaddps_avx512vl(auVar39,auVar40);
                auVar55 = vmulps_avx512vl(auVar53,auVar49);
                auVar55 = vfmsub231ps_avx512vl(auVar55,auVar48,auVar54);
                auVar54 = vmulps_avx512vl(auVar54,auVar47);
                auVar54 = vfmsub231ps_avx512vl(auVar54,auVar49,auVar56);
                auVar56 = vmulps_avx512vl(auVar56,auVar48);
                auVar56 = vfmsub231ps_avx512vl(auVar56,auVar47,auVar53);
                auVar53._4_4_ = fVar94 * auVar56._4_4_;
                auVar53._0_4_ = fVar94 * auVar56._0_4_;
                auVar53._8_4_ = fVar94 * auVar56._8_4_;
                auVar53._12_4_ = fVar94 * auVar56._12_4_;
                auVar53._16_4_ = fVar94 * auVar56._16_4_;
                auVar53._20_4_ = fVar94 * auVar56._20_4_;
                auVar53._24_4_ = fVar94 * auVar56._24_4_;
                auVar53._28_4_ = auVar56._28_4_;
                auVar53 = vfmadd231ps_avx512vl(auVar53,auVar95,auVar54);
                auVar53 = vfmadd231ps_avx512vl(auVar53,auVar91,auVar55);
                auVar54 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar57 = vaddps_avx512vl(auVar57,auVar41);
                auVar58 = vaddps_avx512vl(auVar58,auVar42);
                auVar40 = vaddps_avx512vl(auVar40,auVar43);
                auVar41 = vmulps_avx512vl(auVar58,auVar52);
                auVar41 = vfmsub231ps_avx512vl(auVar41,auVar51,auVar40);
                auVar40 = vmulps_avx512vl(auVar40,auVar50);
                auVar42 = vfmsub231ps_avx512vl(auVar40,auVar52,auVar57);
                auVar40._4_4_ = auVar57._4_4_ * auVar51._4_4_;
                auVar40._0_4_ = auVar57._0_4_ * auVar51._0_4_;
                auVar40._8_4_ = auVar57._8_4_ * auVar51._8_4_;
                auVar40._12_4_ = auVar57._12_4_ * auVar51._12_4_;
                auVar40._16_4_ = auVar57._16_4_ * auVar51._16_4_;
                auVar40._20_4_ = auVar57._20_4_ * auVar51._20_4_;
                auVar40._24_4_ = auVar57._24_4_ * auVar51._24_4_;
                auVar40._28_4_ = auVar57._28_4_;
                auVar32 = vfmsub231ps_fma(auVar40,auVar50,auVar58);
                auVar57 = vmulps_avx512vl(auVar99,ZEXT1632(auVar32));
                auVar57 = vfmadd231ps_avx512vl(auVar57,auVar95,auVar42);
                auVar40 = vfmadd231ps_avx512vl(auVar57,auVar91,auVar41);
                auVar41._0_4_ = auVar38._0_4_ + auVar53._0_4_;
                auVar41._4_4_ = auVar38._4_4_ + auVar53._4_4_;
                auVar41._8_4_ = auVar38._8_4_ + auVar53._8_4_;
                auVar41._12_4_ = auVar38._12_4_ + auVar53._12_4_;
                auVar41._16_4_ = auVar38._16_4_ + auVar53._16_4_;
                auVar41._20_4_ = auVar38._20_4_ + auVar53._20_4_;
                auVar41._24_4_ = auVar38._24_4_ + auVar53._24_4_;
                auVar41._28_4_ = auVar38._28_4_ + auVar53._28_4_;
                local_900 = vaddps_avx512vl(auVar40,auVar41);
                vandps_avx512vl(local_900,auVar54);
                auVar57._8_4_ = 0x34000000;
                auVar57._0_8_ = 0x3400000034000000;
                auVar57._12_4_ = 0x34000000;
                auVar57._16_4_ = 0x34000000;
                auVar57._20_4_ = 0x34000000;
                auVar57._24_4_ = 0x34000000;
                auVar57._28_4_ = 0x34000000;
                auVar57 = vmulps_avx512vl(local_900,auVar57);
                auVar58 = vminps_avx512vl(auVar38,auVar53);
                auVar41 = vminps_avx512vl(auVar58,auVar40);
                auVar58._8_4_ = 0x80000000;
                auVar58._0_8_ = 0x8000000080000000;
                auVar58._12_4_ = 0x80000000;
                auVar58._16_4_ = 0x80000000;
                auVar58._20_4_ = 0x80000000;
                auVar58._24_4_ = 0x80000000;
                auVar58._28_4_ = 0x80000000;
                auVar58 = vxorps_avx512vl(auVar57,auVar58);
                uVar8 = vcmpps_avx512vl(auVar41,auVar58,5);
                auVar58 = vmaxps_avx512vl(auVar38,auVar53);
                auVar58 = vmaxps_avx512vl(auVar58,auVar40);
                uVar9 = vcmpps_avx512vl(auVar58,auVar57,2);
                local_8d8 = (byte)uVar8 | (byte)uVar9;
                if (local_8d8 != 0) {
                  auVar57 = vmulps_avx512vl(auVar46,auVar48);
                  auVar58 = vmulps_avx512vl(auVar44,auVar49);
                  auVar40 = vmulps_avx512vl(auVar45,auVar47);
                  auVar41 = vmulps_avx512vl(auVar49,auVar51);
                  auVar42 = vmulps_avx512vl(auVar47,auVar52);
                  auVar43 = vmulps_avx512vl(auVar48,auVar50);
                  auVar45 = vfmsub213ps_avx512vl(auVar45,auVar49,auVar57);
                  auVar46 = vfmsub213ps_avx512vl(auVar46,auVar47,auVar58);
                  auVar44 = vfmsub213ps_avx512vl(auVar44,auVar48,auVar40);
                  auVar48 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar41);
                  auVar49 = vfmsub213ps_avx512vl(auVar50,auVar49,auVar42);
                  auVar47 = vfmsub213ps_avx512vl(auVar51,auVar47,auVar43);
                  vandps_avx512vl(auVar57,auVar54);
                  vandps_avx512vl(auVar41,auVar54);
                  uVar22 = vcmpps_avx512vl(auVar47,auVar47,1);
                  vandps_avx512vl(auVar58,auVar54);
                  vandps_avx512vl(auVar42,auVar54);
                  uVar25 = vcmpps_avx512vl(auVar47,auVar47,1);
                  vandps_avx512vl(auVar40,auVar54);
                  vandps_avx512vl(auVar43,auVar54);
                  uVar30 = vcmpps_avx512vl(auVar47,auVar47,1);
                  bVar29 = (bool)((byte)uVar22 & 1);
                  auVar59._0_4_ =
                       (float)((uint)bVar29 * auVar45._0_4_ | (uint)!bVar29 * auVar48._0_4_);
                  bVar29 = (bool)((byte)(uVar22 >> 1) & 1);
                  auVar59._4_4_ =
                       (float)((uint)bVar29 * auVar45._4_4_ | (uint)!bVar29 * auVar48._4_4_);
                  bVar29 = (bool)((byte)(uVar22 >> 2) & 1);
                  auVar59._8_4_ =
                       (float)((uint)bVar29 * auVar45._8_4_ | (uint)!bVar29 * auVar48._8_4_);
                  bVar29 = (bool)((byte)(uVar22 >> 3) & 1);
                  auVar59._12_4_ =
                       (float)((uint)bVar29 * auVar45._12_4_ | (uint)!bVar29 * auVar48._12_4_);
                  bVar29 = (bool)((byte)(uVar22 >> 4) & 1);
                  auVar59._16_4_ =
                       (float)((uint)bVar29 * auVar45._16_4_ | (uint)!bVar29 * auVar48._16_4_);
                  bVar29 = (bool)((byte)(uVar22 >> 5) & 1);
                  auVar59._20_4_ =
                       (float)((uint)bVar29 * auVar45._20_4_ | (uint)!bVar29 * auVar48._20_4_);
                  bVar29 = (bool)((byte)(uVar22 >> 6) & 1);
                  auVar59._24_4_ =
                       (float)((uint)bVar29 * auVar45._24_4_ | (uint)!bVar29 * auVar48._24_4_);
                  bVar29 = SUB81(uVar22 >> 7,0);
                  auVar59._28_4_ = (uint)bVar29 * auVar45._28_4_ | (uint)!bVar29 * auVar48._28_4_;
                  bVar29 = (bool)((byte)uVar25 & 1);
                  auVar60._0_4_ =
                       (float)((uint)bVar29 * auVar46._0_4_ | (uint)!bVar29 * auVar49._0_4_);
                  bVar29 = (bool)((byte)(uVar25 >> 1) & 1);
                  auVar60._4_4_ =
                       (float)((uint)bVar29 * auVar46._4_4_ | (uint)!bVar29 * auVar49._4_4_);
                  bVar29 = (bool)((byte)(uVar25 >> 2) & 1);
                  auVar60._8_4_ =
                       (float)((uint)bVar29 * auVar46._8_4_ | (uint)!bVar29 * auVar49._8_4_);
                  bVar29 = (bool)((byte)(uVar25 >> 3) & 1);
                  auVar60._12_4_ =
                       (float)((uint)bVar29 * auVar46._12_4_ | (uint)!bVar29 * auVar49._12_4_);
                  bVar29 = (bool)((byte)(uVar25 >> 4) & 1);
                  auVar60._16_4_ =
                       (float)((uint)bVar29 * auVar46._16_4_ | (uint)!bVar29 * auVar49._16_4_);
                  bVar29 = (bool)((byte)(uVar25 >> 5) & 1);
                  auVar60._20_4_ =
                       (float)((uint)bVar29 * auVar46._20_4_ | (uint)!bVar29 * auVar49._20_4_);
                  bVar29 = (bool)((byte)(uVar25 >> 6) & 1);
                  auVar60._24_4_ =
                       (float)((uint)bVar29 * auVar46._24_4_ | (uint)!bVar29 * auVar49._24_4_);
                  bVar29 = SUB81(uVar25 >> 7,0);
                  auVar60._28_4_ = (uint)bVar29 * auVar46._28_4_ | (uint)!bVar29 * auVar49._28_4_;
                  bVar29 = (bool)((byte)uVar30 & 1);
                  fVar31 = (float)((uint)bVar29 * auVar44._0_4_ | (uint)!bVar29 * auVar47._0_4_);
                  bVar29 = (bool)((byte)(uVar30 >> 1) & 1);
                  fVar63 = (float)((uint)bVar29 * auVar44._4_4_ | (uint)!bVar29 * auVar47._4_4_);
                  bVar29 = (bool)((byte)(uVar30 >> 2) & 1);
                  fVar64 = (float)((uint)bVar29 * auVar44._8_4_ | (uint)!bVar29 * auVar47._8_4_);
                  bVar29 = (bool)((byte)(uVar30 >> 3) & 1);
                  fVar65 = (float)((uint)bVar29 * auVar44._12_4_ | (uint)!bVar29 * auVar47._12_4_);
                  bVar29 = (bool)((byte)(uVar30 >> 4) & 1);
                  fVar66 = (float)((uint)bVar29 * auVar44._16_4_ | (uint)!bVar29 * auVar47._16_4_);
                  bVar29 = (bool)((byte)(uVar30 >> 5) & 1);
                  fVar67 = (float)((uint)bVar29 * auVar44._20_4_ | (uint)!bVar29 * auVar47._20_4_);
                  bVar29 = (bool)((byte)(uVar30 >> 6) & 1);
                  fVar68 = (float)((uint)bVar29 * auVar44._24_4_ | (uint)!bVar29 * auVar47._24_4_);
                  bVar29 = SUB81(uVar30 >> 7,0);
                  auVar13._4_4_ = fVar94 * fVar63;
                  auVar13._0_4_ = fVar94 * fVar31;
                  auVar13._8_4_ = fVar94 * fVar64;
                  auVar13._12_4_ = fVar94 * fVar65;
                  auVar13._16_4_ = fVar94 * fVar66;
                  auVar13._20_4_ = fVar94 * fVar67;
                  auVar13._24_4_ = fVar94 * fVar68;
                  auVar13._28_4_ = fVar94;
                  auVar32 = vfmadd213ps_fma(auVar95,auVar60,auVar13);
                  auVar32 = vfmadd213ps_fma(auVar91,auVar59,ZEXT1632(auVar32));
                  auVar57 = ZEXT1632(CONCAT412(auVar32._12_4_ + auVar32._12_4_,
                                               CONCAT48(auVar32._8_4_ + auVar32._8_4_,
                                                        CONCAT44(auVar32._4_4_ + auVar32._4_4_,
                                                                 auVar32._0_4_ + auVar32._0_4_))));
                  auVar96._0_4_ = auVar39._0_4_ * fVar31;
                  auVar96._4_4_ = auVar39._4_4_ * fVar63;
                  auVar96._8_4_ = auVar39._8_4_ * fVar64;
                  auVar96._12_4_ = auVar39._12_4_ * fVar65;
                  auVar96._16_4_ = auVar39._16_4_ * fVar66;
                  auVar96._20_4_ = auVar39._20_4_ * fVar67;
                  auVar96._24_4_ = auVar39._24_4_ * fVar68;
                  auVar96._28_4_ = 0;
                  auVar32 = vfmadd213ps_fma(auVar61,auVar60,auVar96);
                  auVar37 = vfmadd213ps_fma(auVar62,auVar59,ZEXT1632(auVar32));
                  auVar61 = vrcp14ps_avx512vl(auVar57);
                  auVar62._8_4_ = 0x3f800000;
                  auVar62._0_8_ = 0x3f8000003f800000;
                  auVar62._12_4_ = 0x3f800000;
                  auVar62._16_4_ = 0x3f800000;
                  auVar62._20_4_ = 0x3f800000;
                  auVar62._24_4_ = 0x3f800000;
                  auVar62._28_4_ = 0x3f800000;
                  auVar62 = vfnmadd213ps_avx512vl(auVar61,auVar57,auVar62);
                  auVar32 = vfmadd132ps_fma(auVar62,auVar61,auVar61);
                  local_880 = ZEXT1632(CONCAT412(auVar32._12_4_ * (auVar37._12_4_ + auVar37._12_4_),
                                                 CONCAT48(auVar32._8_4_ *
                                                          (auVar37._8_4_ + auVar37._8_4_),
                                                          CONCAT44(auVar32._4_4_ *
                                                                   (auVar37._4_4_ + auVar37._4_4_),
                                                                   auVar32._0_4_ *
                                                                   (auVar37._0_4_ + auVar37._0_4_)))
                                                ));
                  uVar79 = *(undefined4 *)((long)&(local_b18->org).field_0 + 0xc);
                  auVar61._4_4_ = uVar79;
                  auVar61._0_4_ = uVar79;
                  auVar61._8_4_ = uVar79;
                  auVar61._12_4_ = uVar79;
                  auVar61._16_4_ = uVar79;
                  auVar61._20_4_ = uVar79;
                  auVar61._24_4_ = uVar79;
                  auVar61._28_4_ = uVar79;
                  uVar8 = vcmpps_avx512vl(local_880,auVar61,0xd);
                  auVar55._8_4_ = 0x80000000;
                  auVar55._0_8_ = 0x8000000080000000;
                  auVar55._12_4_ = 0x80000000;
                  auVar55._16_4_ = 0x80000000;
                  auVar55._20_4_ = 0x80000000;
                  auVar55._24_4_ = 0x80000000;
                  auVar55._28_4_ = 0x80000000;
                  auVar62 = vxorps_avx512vl(auVar57,auVar55);
                  fVar94 = local_b18->tfar;
                  auVar11._4_4_ = fVar94;
                  auVar11._0_4_ = fVar94;
                  auVar11._8_4_ = fVar94;
                  auVar11._12_4_ = fVar94;
                  auVar11._16_4_ = fVar94;
                  auVar11._20_4_ = fVar94;
                  auVar11._24_4_ = fVar94;
                  auVar11._28_4_ = fVar94;
                  uVar9 = vcmpps_avx512vl(local_880,auVar11,2);
                  uVar10 = vcmpps_avx512vl(auVar57,auVar62,4);
                  local_8d8 = (byte)uVar8 & (byte)uVar9 & (byte)uVar10 & local_8d8;
                  if (local_8d8 != 0) {
                    local_a00._0_4_ = local_b18->tfar;
                    local_a00._4_4_ = local_b18->mask;
                    local_a00._8_4_ = local_b18->id;
                    local_a00._12_4_ = local_b18->flags;
                    uVar20 = vextractps_avx(local_a00,1);
                    local_8e0 = &local_b29;
                    auVar62 = vsubps_avx(local_900,auVar53);
                    local_940 = vblendps_avx(auVar38,auVar62,0xf0);
                    auVar62 = vsubps_avx(local_900,auVar38);
                    local_920 = vblendps_avx(auVar53,auVar62,0xf0);
                    local_860[0] = auVar59._0_4_ * 1.0;
                    local_860[1] = auVar59._4_4_ * 1.0;
                    local_860[2] = auVar59._8_4_ * 1.0;
                    local_860[3] = auVar59._12_4_ * 1.0;
                    fStack_850 = auVar59._16_4_ * -1.0;
                    fStack_84c = auVar59._20_4_ * -1.0;
                    fStack_848 = auVar59._24_4_ * -1.0;
                    uStack_844 = auVar59._28_4_;
                    local_840._4_4_ = auVar60._4_4_ * 1.0;
                    local_840._0_4_ = auVar60._0_4_ * 1.0;
                    local_840._8_4_ = auVar60._8_4_ * 1.0;
                    local_840._12_4_ = auVar60._12_4_ * 1.0;
                    local_840._16_4_ = auVar60._16_4_ * -1.0;
                    local_840._20_4_ = auVar60._20_4_ * -1.0;
                    local_840._24_4_ = auVar60._24_4_ * -1.0;
                    local_840._28_4_ = auVar60._28_4_;
                    local_820._4_4_ = fVar63 * 1.0;
                    local_820._0_4_ = fVar31 * 1.0;
                    local_820._8_4_ = fVar64 * 1.0;
                    local_820._12_4_ = fVar65 * 1.0;
                    local_820._16_4_ = fVar66 * -1.0;
                    local_820._20_4_ = fVar67 * -1.0;
                    local_820._24_4_ = fVar68 * -1.0;
                    local_820._28_4_ =
                         (uint)bVar29 * auVar44._28_4_ | (uint)!bVar29 * auVar47._28_4_;
                    local_af0 = (local_ae8->geometries).items[local_ae0].ptr;
                    if ((local_af0->mask & uVar20) != 0) {
                      local_b28 = local_ad8->args;
                      if ((local_b28->filter == (RTCFilterFunctionN)0x0) &&
                         (local_af0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0068d876:
                        local_b18->tfar = -INFINITY;
                        return;
                      }
                      auVar62 = vpbroadcastd_avx512vl();
                      auVar62 = vpaddd_avx2(auVar62,_DAT_01fec4a0);
                      auVar61 = vpbroadcastd_avx512vl();
                      auVar61 = vpaddd_avx2(auVar61,_DAT_01fec4c0);
                      auVar87._0_4_ = (float)(int)(*(ushort *)(lVar18 + 8 + lVar19) - 1);
                      auVar87._4_12_ = auVar39._4_12_;
                      auVar16._12_4_ = 0;
                      auVar16._0_12_ = ZEXT812(0);
                      auVar37 = vrcp14ss_avx512f(auVar16 << 0x20,ZEXT416((uint)auVar87._0_4_));
                      auVar32 = vfnmadd213ss_fma(auVar87,auVar37,SUB6416(ZEXT464(0x40000000),0));
                      auVar93._0_4_ = (float)(int)(*(ushort *)(lVar18 + 10 + lVar19) - 1);
                      auVar93._4_12_ = auVar38._4_12_;
                      fVar68 = auVar37._0_4_ * auVar32._0_4_;
                      auVar37 = vrcp14ss_avx512f(auVar16 << 0x20,ZEXT416((uint)auVar93._0_4_));
                      auVar32 = vfnmadd213ss_fma(auVar93,auVar37,SUB6416(ZEXT464(0x40000000),0));
                      fVar7 = auVar32._0_4_ * auVar37._0_4_;
                      auVar62 = vcvtdq2ps_avx(auVar62);
                      auVar61 = vcvtdq2ps_avx(auVar61);
                      auVar12._8_4_ = 0x219392ef;
                      auVar12._0_8_ = 0x219392ef219392ef;
                      auVar12._12_4_ = 0x219392ef;
                      auVar12._16_4_ = 0x219392ef;
                      auVar12._20_4_ = 0x219392ef;
                      auVar12._24_4_ = 0x219392ef;
                      auVar12._28_4_ = 0x219392ef;
                      uVar22 = vcmpps_avx512vl(local_900,auVar12,5);
                      auVar57 = vrcp14ps_avx512vl(local_900);
                      auVar88._8_4_ = 0x3f800000;
                      auVar88._0_8_ = 0x3f8000003f800000;
                      auVar88._12_4_ = 0x3f800000;
                      auVar88._16_4_ = 0x3f800000;
                      auVar88._20_4_ = 0x3f800000;
                      auVar88._24_4_ = 0x3f800000;
                      auVar88._28_4_ = 0x3f800000;
                      auVar32 = vfnmadd213ps_fma(local_900,auVar57,auVar88);
                      auVar58 = vfmadd132ps_avx512vl(ZEXT1632(auVar32),auVar57,auVar57);
                      fVar67 = (float)((uint)((byte)uVar22 & 1) * auVar58._0_4_);
                      fVar66 = (float)((uint)((byte)(uVar22 >> 1) & 1) * auVar58._4_4_);
                      fVar65 = (float)((uint)((byte)(uVar22 >> 2) & 1) * auVar58._8_4_);
                      fVar64 = (float)((uint)((byte)(uVar22 >> 3) & 1) * auVar58._12_4_);
                      fVar63 = (float)((uint)((byte)(uVar22 >> 4) & 1) * auVar58._16_4_);
                      fVar31 = (float)((uint)((byte)(uVar22 >> 5) & 1) * auVar58._20_4_);
                      fVar94 = (float)((uint)((byte)(uVar22 >> 6) & 1) * auVar58._24_4_);
                      auVar14._4_4_ =
                           (local_900._4_4_ * auVar62._4_4_ + local_940._4_4_) * fVar68 * fVar66;
                      auVar14._0_4_ =
                           (local_900._0_4_ * auVar62._0_4_ + local_940._0_4_) * fVar68 * fVar67;
                      auVar14._8_4_ =
                           (local_900._8_4_ * auVar62._8_4_ + local_940._8_4_) * fVar68 * fVar65;
                      auVar14._12_4_ =
                           (local_900._12_4_ * auVar62._12_4_ + local_940._12_4_) * fVar68 * fVar64;
                      auVar14._16_4_ =
                           (local_900._16_4_ * auVar62._16_4_ + local_940._16_4_) * fVar68 * fVar63;
                      auVar14._20_4_ =
                           (local_900._20_4_ * auVar62._20_4_ + local_940._20_4_) * fVar68 * fVar31;
                      auVar14._24_4_ =
                           (local_900._24_4_ * auVar62._24_4_ + local_940._24_4_) * fVar68 * fVar94;
                      auVar14._28_4_ = auVar57._28_4_;
                      local_8c0 = vminps_avx(auVar14,auVar88);
                      auVar15._4_4_ =
                           (local_900._4_4_ * auVar61._4_4_ + local_920._4_4_) * fVar7 * fVar66;
                      auVar15._0_4_ =
                           (local_900._0_4_ * auVar61._0_4_ + local_920._0_4_) * fVar7 * fVar67;
                      auVar15._8_4_ =
                           (local_900._8_4_ * auVar61._8_4_ + local_920._8_4_) * fVar7 * fVar65;
                      auVar15._12_4_ =
                           (local_900._12_4_ * auVar61._12_4_ + local_920._12_4_) * fVar7 * fVar64;
                      auVar15._16_4_ =
                           (local_900._16_4_ * auVar61._16_4_ + local_920._16_4_) * fVar7 * fVar63;
                      auVar15._20_4_ =
                           (local_900._20_4_ * auVar61._20_4_ + local_920._20_4_) * fVar7 * fVar31;
                      auVar15._24_4_ =
                           (local_900._24_4_ * auVar61._24_4_ + local_920._24_4_) * fVar7 * fVar94;
                      auVar15._28_4_ = (uint)(byte)(uVar22 >> 7) * auVar58._28_4_;
                      local_8a0 = vminps_avx(auVar15,auVar88);
                      local_b08 = 0;
                      local_b10 = (ulong)local_8d8;
                      for (uVar22 = local_b10; (uVar22 & 1) == 0;
                          uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                        local_b08 = local_b08 + 1;
                      }
                      local_b20 = local_ad8->user;
                      local_9a0 = auVar102._0_16_;
                      local_9b0 = auVar103._0_16_;
                      local_9c0 = auVar104._0_16_;
                      local_9d0 = auVar105._0_16_;
                      local_9e0 = auVar106._0_16_;
                      local_9f0 = auVar107._0_16_;
                      do {
                        local_a54 = *(undefined4 *)(local_8c0 + local_b08 * 4);
                        local_a50 = *(undefined4 *)(local_8a0 + local_b08 * 4);
                        local_b18->tfar = local_860[local_b08 - 8];
                        local_a60 = local_860[local_b08];
                        local_a5c = *(undefined4 *)(local_840 + local_b08 * 4);
                        local_a58 = *(undefined4 *)(local_820 + local_b08 * 4);
                        local_a4c = (undefined4)local_ac0;
                        local_a48 = (undefined4)local_ae0;
                        local_a44 = local_b20->instID[0];
                        local_a40 = local_b20->instPrimID[0];
                        local_af4 = -1;
                        local_a30.valid = &local_af4;
                        local_a30.geometryUserPtr = local_af0->userPtr;
                        local_a30.context = local_b20;
                        local_a30.ray = (RTCRayN *)local_b18;
                        local_a30.hit = (RTCHitN *)&local_a60;
                        local_a30.N = 1;
                        if (((local_af0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                            ((*local_af0->occlusionFilterN)(&local_a30), *local_a30.valid != 0)) &&
                           ((local_b28->filter == (RTCFilterFunctionN)0x0 ||
                            ((((local_b28->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                               RTC_RAY_QUERY_FLAG_INCOHERENT &&
                              (((local_af0->field_8).field_0x2 & 0x40) == 0)) ||
                             ((*local_b28->filter)(&local_a30), *local_a30.valid != 0))))))
                        goto LAB_0068d876;
                        local_b18->tfar = (float)local_a00._0_4_;
                        uVar22 = local_b08 & 0x3f;
                        local_b08 = 0;
                        local_b10 = local_b10 ^ 1L << uVar22;
                        for (uVar22 = local_b10; (uVar22 & 1) == 0;
                            uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                          local_b08 = local_b08 + 1;
                        }
                        auVar102 = ZEXT1664(local_9a0);
                        auVar103 = ZEXT1664(local_9b0);
                        auVar104 = ZEXT1664(local_9c0);
                        auVar105 = ZEXT1664(local_9d0);
                        auVar106 = ZEXT1664(local_9e0);
                        auVar107 = ZEXT1664(local_9f0);
                      } while (local_b10 != 0);
                    }
                  }
                }
                uVar30 = local_aa0 - 1 & local_aa0;
                auVar97 = ZEXT1664(local_960);
                auVar98 = ZEXT1664(local_970);
                auVar100 = ZEXT1664(local_980);
                auVar101 = ZEXT1664(local_990);
                uVar22 = local_ac8;
                uVar25 = local_ad0;
                fVar64 = local_950;
                fVar94 = fStack_94c;
                fVar31 = fStack_948;
                fVar63 = fStack_944;
              } while (uVar30 != 0);
            }
            local_ab8 = local_ab8 + 1;
          } while (local_ab8 != local_ab0);
        }
LAB_0068d85e:
      } while (local_aa8 != &local_800);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }